

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O1

void nghttp2_bufs_seek_last_present(nghttp2_bufs *bufs)

{
  nghttp2_buf_chain *pnVar1;
  
  for (pnVar1 = bufs->cur;
      (pnVar1 != (nghttp2_buf_chain *)0x0 && ((pnVar1->buf).last != (pnVar1->buf).pos));
      pnVar1 = pnVar1->next) {
    bufs->cur = pnVar1;
  }
  return;
}

Assistant:

void nghttp2_bufs_seek_last_present(nghttp2_bufs *bufs) {
  nghttp2_buf_chain *ci;

  for (ci = bufs->cur; ci; ci = ci->next) {
    if (nghttp2_buf_len(&ci->buf) == 0) {
      return;
    } else {
      bufs->cur = ci;
    }
  }
}